

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O1

void __thiscall
soul::AST::Context::throwError(Context *this,CompileMessage *message,bool isStaticAssertion)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  SourceCodeText *pSVar2;
  pointer pcVar3;
  CallOrCastBase *this_00;
  long lVar4;
  int iVar5;
  undefined4 extraout_var;
  long *plVar7;
  Scope *pSVar8;
  size_type *psVar9;
  char *pcVar10;
  char *message_00;
  CompileMessage error;
  CompileMessageGroup messages;
  string local_1a8;
  CompileMessage local_188;
  CompileMessage *local_150;
  string local_148;
  undefined1 local_128 [248];
  long lVar6;
  undefined4 extraout_var_00;
  
  local_128._0_8_ = local_128 + 0x18;
  local_128._8_8_ = 0;
  local_128._16_8_ = 4;
  pSVar2 = (this->location).sourceCode.object;
  if (pSVar2 != (SourceCodeText *)0x0) {
    (pSVar2->super_RefCountedObject).refCount = (pSVar2->super_RefCountedObject).refCount + 1;
  }
  pcVar10 = (this->location).location.data;
  paVar1 = &local_188.description.field_2;
  pcVar3 = (message->description)._M_dataplus._M_p;
  local_188.description._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_188,pcVar3,pcVar3 + (message->description)._M_string_length);
  local_188.category = none;
  local_188.type = message->type;
  local_188.location.sourceCode.object = pSVar2;
  local_188.location.location.data = pcVar10;
  ArrayWithPreallocation<soul::CompileMessage,_4UL>::push_back
            ((ArrayWithPreallocation<soul::CompileMessage,_4UL> *)local_128,&local_188);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_188.location.sourceCode.object);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188.description._M_dataplus._M_p != paVar1) {
    operator_delete(local_188.description._M_dataplus._M_p,
                    local_188.description.field_2._M_allocated_capacity + 1);
  }
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)0x0);
  pSVar8 = this->parentScope;
  local_150 = message;
  do {
    if ((pSVar8 == (Scope *)0x0) || (9 < (ulong)local_128._8_8_)) {
      soul::throwError((CompileMessageGroup *)local_128);
    }
    iVar5 = (*pSVar8->_vptr_Scope[8])(pSVar8);
    lVar6 = CONCAT44(extraout_var,iVar5);
    if ((lVar6 != 0) &&
       (this_00 = *(CallOrCastBase **)(lVar6 + 0xa8), this_00 != (CallOrCastBase *)0x0)) {
      if (*(long *)(lVar6 + 0xa0) == 0) {
        iVar5 = 0x3c;
        pcVar10 = "operator->";
        message_00 = "object != nullptr";
LAB_001c5300:
        throwInternalCompilerError(message_00,pcVar10,iVar5);
      }
      plVar7 = *(long **)(*(long *)(lVar6 + 0xa0) + 0x38);
      if (plVar7 == (long *)0x0) {
        iVar5 = 0x21;
        message_00 = "isValid()";
        pcVar10 = "operator const std::basic_string<char> &";
        goto LAB_001c5300;
      }
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_148,*plVar7,plVar7[1] + *plVar7);
      CallOrCastBase::getDescription(&local_1a8,this_00,&local_148);
      plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_1a8,0,(char *)0x0,0x2873f4);
      psVar9 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_188.description.field_2._M_allocated_capacity = *psVar9;
        local_188.description.field_2._8_8_ = plVar7[3];
        local_188.description._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_188.description.field_2._M_allocated_capacity = *psVar9;
        local_188.description._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_188.description._M_string_length = plVar7[1];
      *plVar7 = (long)psVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      lVar4 = *(long *)(lVar6 + 0xa8);
      if (lVar4 == 0) {
        throwInternalCompilerError("object != nullptr","operator->",0x3c);
      }
      local_188.location.sourceCode.object = *(SourceCodeText **)(lVar4 + 0x10);
      if (local_188.location.sourceCode.object != (SourceCodeText *)0x0) {
        ((local_188.location.sourceCode.object)->super_RefCountedObject).refCount =
             ((local_188.location.sourceCode.object)->super_RefCountedObject).refCount + 1;
      }
      local_188.location.location.data = *(char **)(lVar4 + 0x18);
      local_188.type = error;
      local_188.category = none;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
      }
      pSVar2 = (this->location).sourceCode.object;
      if (pSVar2 == (SourceCodeText *)0x0) {
        iVar5 = 0x47;
LAB_001c5329:
        throwInternalCompilerError("object != nullptr","operator->",iVar5);
      }
      if (pSVar2->isInternal == true) {
        ArrayWithPreallocation<soul::CompileMessage,_4UL>::clear
                  ((ArrayWithPreallocation<soul::CompileMessage,_4UL> *)local_128);
        if (isStaticAssertion) {
          std::__cxx11::string::_M_assign((string *)&local_188);
        }
        else {
          std::operator+(&local_1a8,", error: ",&local_150->description);
          std::__cxx11::string::_M_append((char *)&local_188,(ulong)local_1a8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
            operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
          }
        }
        ArrayWithPreallocation<soul::CompileMessage,_4UL>::push_back
                  ((ArrayWithPreallocation<soul::CompileMessage,_4UL> *)local_128,&local_188);
      }
      else {
        ArrayWithPreallocation<soul::CompileMessage,_4UL>::insert
                  ((ArrayWithPreallocation<soul::CompileMessage,_4UL> *)local_128,
                   (CompileMessage *)local_128._0_8_,&local_188);
      }
      if (*(long *)(lVar6 + 0xa8) == 0) {
        iVar5 = 0x3c;
        goto LAB_001c5329;
      }
      pSVar8 = *(Scope **)(*(long *)(lVar6 + 0xa8) + 0x20);
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_188.location.sourceCode.object);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188.description._M_dataplus._M_p != paVar1) {
        operator_delete(local_188.description._M_dataplus._M_p,
                        local_188.description.field_2._M_allocated_capacity + 1);
      }
    }
    iVar5 = (*pSVar8->_vptr_Scope[4])(pSVar8);
    pSVar8 = (Scope *)CONCAT44(extraout_var_00,iVar5);
  } while( true );
}

Assistant:

[[noreturn]] void throwError (CompileMessage message, bool isStaticAssertion = false) const
        {
            CompileMessageGroup messages;
            messages.messages.push_back (message.withLocation (location));

            for (auto p = parentScope; p != nullptr && messages.messages.size() < 10; p = p->getParentScope())
            {
                if (auto f = p->getAsFunction())
                {
                    if (f->originalCallLeadingToSpecialisation != nullptr)
                    {
                        CompileMessage error { "Failed to instantiate generic function "
                                                  + f->originalCallLeadingToSpecialisation->getDescription (f->originalGenericFunction->name),
                                               f->originalCallLeadingToSpecialisation->context.location,
                                               CompileMessage::Type::error };

                        if (location.sourceCode->isInternal)
                        {
                            messages.messages.clear();

                            if (isStaticAssertion)
                                error.description = message.description;
                            else
                                error.description += ", error: " + message.description;

                            messages.messages.push_back (error);
                        }
                        else
                        {
                            messages.messages.insert (messages.messages.begin(), error);
                        }

                        p = f->originalCallLeadingToSpecialisation->context.parentScope;
                    }
                }
            }

            soul::throwError (messages);
        }